

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O1

void cfd::api::json::TransactionJsonApi::DecodeRawTransaction
               (DecodeRawTransactionRequest *request,DecodeRawTransactionResponse *response)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  Script *object;
  pointer pAVar3;
  ByteData *pBVar4;
  bool bVar5;
  NetType type;
  uint32_t uVar6;
  CfdException *pCVar7;
  _func_int **pp_Var8;
  undefined1 this [8];
  pointer pTVar9;
  pointer object_00;
  int64_t require_num;
  string script_type;
  DecodeRawTransactionTxIn res_txin;
  DecodeRawTransactionTxOut res_txout;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list;
  DecodeLockingScript script_pub_key_res;
  Transaction tx;
  Script locking_script;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addresses;
  AddressFactory addr_factory;
  int64_t local_4d0;
  string local_4c8;
  string local_4a8;
  pointer local_488;
  undefined1 local_480 [8];
  WitnessVersion local_478 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  char local_460 [16];
  pointer local_450;
  string local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  string local_428 [8];
  pointer local_420;
  undefined1 local_408 [96];
  string local_3a8 [24];
  undefined1 local_390 [16];
  pointer local_380;
  Script local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  undefined1 local_308 [8];
  undefined1 local_300 [48];
  int64_t local_2d0;
  uint32_t local_2c8;
  DecodeLockingScript local_2c0;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> local_200;
  undefined1 local_1e8 [8];
  ByteData *local_1e0;
  ByteData local_1d8;
  string local_1b0 [32];
  string local_190 [32];
  int local_170;
  string local_168 [40];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_140 [24];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_128;
  Transaction local_110;
  Script local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_78;
  AddressFactory local_58;
  
  if (request == (DecodeRawTransactionRequest *)0x0) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_480 = (undefined1  [8])&local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"request is null.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_480);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (response == (DecodeRawTransactionResponse *)0x0) {
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_480 = (undefined1  [8])&local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"response is null.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_480);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  pcVar2 = (request->hex_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,pcVar2,pcVar2 + (request->hex_)._M_string_length);
  if (local_4c8._M_string_length == 0) {
    local_480 = (undefined1  [8])0x5f90bd;
    local_478[0] = 0x4b;
    local_470._M_allocated_capacity = (long)"ElementsDecodeRawTransaction" + 8;
    core::logger::log<>((CfdSourceLocation *)local_480,kCfdLogLevelWarning,
                        "Failed to DecodeRawTransactionRequest. hex empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_480 = (undefined1  [8])&local_470;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_480,"Invalid hex string. empty data.","");
    core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_480);
    __cxa_throw(pCVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_480 = (undefined1  [8])&local_470;
  pcVar2 = (request->network_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_480,pcVar2,pcVar2 + (request->network_)._M_string_length);
  type = ConvertNetType((string *)local_480);
  if (local_480 != (undefined1  [8])&local_470) {
    operator_delete((void *)local_480);
  }
  core::Transaction::Transaction(&local_110,&local_4c8);
  core::AbstractTransaction::GetTxid((Txid *)local_308,&local_110.super_AbstractTransaction);
  core::Txid::GetHex_abi_cxx11_((string *)local_480,(Txid *)local_308);
  std::__cxx11::string::_M_assign((string *)&response->txid_);
  if (local_480 != (undefined1  [8])&local_470) {
    operator_delete((void *)local_480);
  }
  local_308 = (undefined1  [8])&PTR__Txid_00735400;
  if ((pointer)local_300._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_300._0_8_);
  }
  core::AbstractTransaction::GetWitnessHash
            ((ByteData256 *)local_1e8,&local_110.super_AbstractTransaction);
  core::Txid::Txid((Txid *)local_308,(ByteData256 *)local_1e8);
  core::Txid::GetHex_abi_cxx11_((string *)local_480,(Txid *)local_308);
  std::__cxx11::string::_M_assign((string *)&response->hash_);
  if (local_480 != (undefined1  [8])&local_470) {
    operator_delete((void *)local_480);
  }
  local_308 = (undefined1  [8])&PTR__Txid_00735400;
  if ((pointer)local_300._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_300._0_8_);
  }
  if (local_1e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1e8);
  }
  uVar6 = core::Transaction::GetTotalSize(&local_110);
  response->size_ = uVar6;
  uVar6 = core::Transaction::GetVsize(&local_110);
  response->vsize_ = uVar6;
  uVar6 = core::Transaction::GetWeight(&local_110);
  response->weight_ = uVar6;
  uVar6 = core::AbstractTransaction::GetVersion(&local_110.super_AbstractTransaction);
  response->version_ = uVar6;
  uVar6 = core::AbstractTransaction::GetLockTime(&local_110.super_AbstractTransaction);
  response->locktime_ = uVar6;
  core::Transaction::GetTxInList
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &local_d0,&local_110);
  if (local_d0._vptr_Script !=
      (_func_int **)
      local_d0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pp_Var1 = (_func_int **)(local_300 + 8);
    pp_Var8 = local_d0._vptr_Script;
    do {
      DecodeRawTransactionTxIn::DecodeRawTransactionTxIn((DecodeRawTransactionTxIn *)local_480);
      bVar5 = core::AbstractTransaction::IsCoinBase(&local_110.super_AbstractTransaction);
      local_308 = (undefined1  [8])pp_Var1;
      if (bVar5) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"txid","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if (local_308 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_308);
        }
        local_308 = (undefined1  [8])pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"vout","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if (local_308 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_308);
        }
        local_308 = (undefined1  [8])pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"scriptSig","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if (local_308 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_308);
        }
        local_308 = (undefined1  [8])pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"txinwitness","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if (local_308 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_308);
        }
        core::Script::Script((Script *)local_308,(Script *)(pp_Var8 + 6));
        bVar5 = core::Script::IsEmpty((Script *)local_308);
        core::Script::~Script((Script *)local_308);
        if (!bVar5) {
          core::Script::Script((Script *)local_308,(Script *)(pp_Var8 + 6));
          core::Script::GetHex_abi_cxx11_((string *)local_1e8,(Script *)local_308);
          std::__cxx11::string::_M_assign(local_448);
          if (local_1e8 != (undefined1  [8])&local_1d8) {
            operator_delete((void *)local_1e8);
          }
          core::Script::~Script((Script *)local_308);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"coinbase","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
        if (local_308 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_308);
        }
        core::Txid::Txid((Txid *)local_1e8,(Txid *)(pp_Var8 + 1));
        core::Txid::GetHex_abi_cxx11_((string *)local_308,(Txid *)local_1e8);
        std::__cxx11::string::_M_assign(local_428);
        if (local_308 != (undefined1  [8])pp_Var1) {
          operator_delete((void *)local_308);
        }
        local_1e8 = (undefined1  [8])&PTR__Txid_00735400;
        if (local_1e0 != (ByteData *)0x0) {
          operator_delete(local_1e0);
        }
        local_408._0_4_ = *(undefined4 *)(pp_Var8 + 5);
        object = (Script *)(pp_Var8 + 6);
        core::Script::Script((Script *)local_308,object);
        bVar5 = core::Script::IsEmpty((Script *)local_308);
        core::Script::~Script((Script *)local_308);
        if (!bVar5) {
          core::Script::Script((Script *)local_308,object);
          core::Script::ToString_abi_cxx11_((string *)local_1e8,(Script *)local_308);
          std::__cxx11::string::_M_assign((string *)(local_408 + 0x40));
          if (local_1e8 != (undefined1  [8])&local_1d8) {
            operator_delete((void *)local_1e8);
          }
          core::Script::~Script((Script *)local_308);
          core::Script::Script((Script *)local_308,object);
          core::Script::GetHex_abi_cxx11_((string *)local_1e8,(Script *)local_308);
          std::__cxx11::string::_M_assign(local_3a8);
          if (local_1e8 != (undefined1  [8])&local_1d8) {
            operator_delete((void *)local_1e8);
          }
          core::Script::~Script((Script *)local_308);
        }
        local_308 = (undefined1  [8])&PTR__ScriptWitness_00735628;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_300,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   (pp_Var8 + 0xf));
        core::ScriptWitness::GetWitness
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_1e8,
                   (ScriptWitness *)local_308);
        local_308 = (undefined1  [8])&PTR__ScriptWitness_00735628;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_300);
        pBVar4 = local_1e0;
        for (this = local_1e8; this != (undefined1  [8])pBVar4;
            this = (undefined1  [8])((long)this + 0x18)) {
          core::ByteData::GetHex_abi_cxx11_((string *)local_308,(ByteData *)this);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_380
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308
                    );
          if (local_308 != (undefined1  [8])pp_Var1) {
            operator_delete((void *)local_308);
          }
        }
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_1e8);
        if (local_380 == (pointer)local_378._vptr_Script) {
          local_308 = (undefined1  [8])pp_Var1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"txinwitness","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_478,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308)
          ;
          if (local_308 != (undefined1  [8])pp_Var1) {
            operator_delete((void *)local_308);
          }
        }
      }
      local_378.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = *(uint32_t *)(pp_Var8 + 0xd);
      std::
      vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
      ::push_back(&(response->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
                   super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                  ,(DecodeRawTransactionTxIn *)local_480);
      DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn((DecodeRawTransactionTxIn *)local_480);
      pp_Var8 = pp_Var8 + 0x12;
    } while (pp_Var8 !=
             (_func_int **)
             local_d0.script_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             &local_d0);
  core::Transaction::GetTxOutList(&local_128,&local_110);
  local_488 = local_128.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_128.
      super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
    pTVar9 = local_128.
             super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      DecodeRawTransactionTxOut::DecodeRawTransactionTxOut((DecodeRawTransactionTxOut *)local_308);
      local_480 = (undefined1  [8])(pTVar9->super_AbstractTxOutReference).value_.amount_;
      local_478[0] = CONCAT31(local_478[0]._1_3_,
                              (pTVar9->super_AbstractTxOutReference).value_.ignore_check_);
      local_2d0 = core::Amount::GetSatoshiValue((Amount *)local_480);
      local_2c8 = uVar6;
      DecodeLockingScript::DecodeLockingScript((DecodeLockingScript *)local_1e8);
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      core::Script::Script(&local_d0,&(pTVar9->super_AbstractTxOutReference).locking_script_);
      core::Script::GetHex_abi_cxx11_((string *)local_480,&local_d0);
      std::__cxx11::string::_M_assign(local_190);
      if (local_480 != (undefined1  [8])&local_470) {
        operator_delete((void *)local_480);
      }
      core::Script::ToString_abi_cxx11_((string *)local_480,&local_d0);
      std::__cxx11::string::_M_assign(local_1b0);
      if (local_480 != (undefined1  [8])&local_470) {
        operator_delete((void *)local_480);
      }
      AddressFactory::AddressFactory(&local_58,type);
      local_4d0 = 0;
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      local_4a8._M_string_length = 0;
      local_4a8.field_2._M_local_buf[0] = '\0';
      ConvertFromLockingScript(&local_200,&local_58,&local_d0,&local_4a8,&local_4d0);
      std::__cxx11::string::_M_assign(local_168);
      pAVar3 = local_200.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_170 = (int)local_4d0;
      object_00 = local_200.
                  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      if (local_200.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_200.super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_480 = (undefined1  [8])&local_470;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"reqSigs","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
        if (local_480 != (undefined1  [8])&local_470) {
          operator_delete((void *)local_480);
        }
        local_480 = (undefined1  [8])&local_470;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"addresses","");
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
        if (local_480 != (undefined1  [8])&local_470) {
          operator_delete((void *)local_480);
        }
      }
      else {
        do {
          core::Address::Address((Address *)local_480,object_00);
          core::Address::GetAddress_abi_cxx11_(&local_78,(Address *)local_480);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_140,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_338);
          core::Script::~Script(&local_378);
          local_408._0_8_ = &PTR__TaprootScriptTree_00740b18;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     local_390);
          core::TapBranch::~TapBranch((TapBranch *)local_408);
          if (local_420 != (pointer)0x0) {
            operator_delete(local_420);
          }
          if ((void *)local_438._M_allocated_capacity != (void *)0x0) {
            operator_delete((void *)local_438._M_allocated_capacity);
          }
          if (local_450 != (pointer)0x0) {
            operator_delete(local_450);
          }
          if ((char *)local_470._M_allocated_capacity != local_460) {
            operator_delete((void *)local_470._M_allocated_capacity);
          }
          object_00 = object_00 + 1;
        } while (object_00 != pAVar3);
      }
      DecodeRawTransactionTxOut::SetScriptPubKey
                ((DecodeRawTransactionTxOut *)local_308,(DecodeLockingScript *)local_1e8);
      std::
      vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
      ::push_back(&(response->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
                   super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
                  ,(value_type *)local_308);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector(&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
      local_58._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_58.prefix_list_);
      core::Script::~Script(&local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      DecodeLockingScript::~DecodeLockingScript((DecodeLockingScript *)local_1e8);
      local_308 = (undefined1  [8])&PTR__DecodeRawTransactionTxOut_007415b8;
      DecodeLockingScript::~DecodeLockingScript(&local_2c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_300);
      pTVar9 = pTVar9 + 1;
    } while (pTVar9 != local_488);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            (&local_128);
  core::Transaction::~Transaction(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TransactionJsonApi::DecodeRawTransaction(
    DecodeRawTransactionRequest* request,
    DecodeRawTransactionResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate version number
  const std::string& hex_string = request->GetHex();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to DecodeRawTransactionRequest. hex empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }
  // TODO(k-matsuzawa): iswitness未使用。bitcoincoreの指定方法が不明瞭

  NetType net_type = ConvertNetType(request->GetNetwork());

  // TransactionController作成
  Transaction tx(hex_string);

  response->SetTxid(tx.GetTxid().GetHex());
  response->SetHash(Txid(tx.GetWitnessHash()).GetHex());
  response->SetSize(tx.GetTotalSize());
  response->SetVsize(tx.GetVsize());
  response->SetWeight(tx.GetWeight());
  response->SetVersion(tx.GetVersion());
  response->SetLocktime(tx.GetLockTime());

  // TxInの追加
  for (const TxInReference& tx_in_ref : tx.GetTxInList()) {
    DecodeRawTransactionTxIn res_txin;
    if (tx.IsCoinBase()) {
      res_txin.SetIgnoreItem("txid");
      res_txin.SetIgnoreItem("vout");
      res_txin.SetIgnoreItem("scriptSig");
      res_txin.SetIgnoreItem("txinwitness");

      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.SetCoinbase(tx_in_ref.GetUnlockingScript().GetHex());
      }
    } else {
      res_txin.SetIgnoreItem("coinbase");

      res_txin.SetTxid(tx_in_ref.GetTxid().GetHex());
      res_txin.SetVout(tx_in_ref.GetVout());
      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.GetScriptSig().SetAsm(tx_in_ref.GetUnlockingScript().ToString());
        res_txin.GetScriptSig().SetHex(tx_in_ref.GetUnlockingScript().GetHex());
      }
      for (const ByteData& witness :
           tx_in_ref.GetScriptWitness().GetWitness()) {  // NOLINT
        res_txin.GetTxinwitness().push_back(witness.GetHex());
      }
      if (res_txin.GetTxinwitness().empty()) {
        // txinwitnessを除外
        res_txin.SetIgnoreItem("txinwitness");
      }
    }
    res_txin.SetSequence(tx_in_ref.GetSequence());
    response->GetVin().push_back(res_txin);
  }

  // TxOutの追加
  int32_t txout_count = 0;
  for (const TxOutReference& txout_ref : tx.GetTxOutList()) {
    DecodeRawTransactionTxOut res_txout;
    res_txout.SetValue(txout_ref.GetValue().GetSatoshiValue());
    res_txout.SetN(txout_count);

    DecodeLockingScript script_pub_key_res;
    std::vector<std::string> addresses;
    Script locking_script = txout_ref.GetLockingScript();
    script_pub_key_res.SetHex(locking_script.GetHex());
    script_pub_key_res.SetAsm(locking_script.ToString());

    AddressFactory addr_factory(net_type);
    int64_t require_num = 0;
    std::string script_type;
    auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
        addr_factory, locking_script, &script_type, &require_num);
    script_pub_key_res.SetType(script_type);
    script_pub_key_res.SetReqSigs(require_num);
    if (addr_list.empty()) {
      script_pub_key_res.SetIgnoreItem("reqSigs");
      script_pub_key_res.SetIgnoreItem("addresses");
    } else {
      for (auto addr : addr_list) {
        script_pub_key_res.GetAddresses().push_back(addr.GetAddress());
      }
    }
    res_txout.SetScriptPubKey(script_pub_key_res);

    response->GetVout().push_back(res_txout);
    ++txout_count;
  }
}